

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall MutableS2ShapeIndex::ApplyUpdatesInternal(MutableS2ShapeIndex *this)

{
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar1;
  pointer pRVar2;
  pointer pFVar3;
  void *pvVar4;
  pointer pBVar5;
  int id;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *face_edges;
  pointer batch;
  RemovedShape *pending_removal;
  RemovedShape *removed;
  long lVar6;
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  batches;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  all_edges [6];
  InteriorTracker tracker;
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  local_1c8;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  local_1a8 [6];
  InteriorTracker local_110;
  
  local_1c8.
  super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (BatchDescriptor *)0x0;
  local_1c8.
  super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (BatchDescriptor *)0x0;
  local_1c8.
  super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetUpdateBatches(this,&local_1c8);
  pBVar5 = local_1c8.
           super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    batch = local_1c8.
            super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      memset(local_1a8,0,0x90);
      ReserveSpace(this,batch,local_1a8);
      InteriorTracker::InteriorTracker(&local_110);
      pvVar1 = (this->pending_removals_)._M_t.
               super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
               .
               super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
               ._M_head_impl;
      if (pvVar1 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                     *)0x0) {
        pRVar2 = *(pointer *)
                  ((long)&(pvVar1->
                          super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                          )._M_impl + 8);
        for (removed = *(RemovedShape **)
                        &(pvVar1->
                         super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                         )._M_impl; removed != pRVar2; removed = removed + 1) {
          RemoveShape(this,removed,local_1a8,&local_110);
        }
        std::
        __uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
        ::reset((__uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
                 *)&this->pending_removals_,(pointer)0x0);
      }
      for (id = this->pending_additions_begin_; id < batch->additions_end; id = id + 1) {
        AddShape(this,id,local_1a8,&local_110);
      }
      lVar6 = 0;
      face_edges = local_1a8;
      do {
        UpdateFaceEdges(this,(int)lVar6,face_edges,&local_110);
        pFVar3 = (face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (face_edges->
        super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (face_edges->
        super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (face_edges->
        super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pFVar3 != (pointer)0x0) {
          operator_delete(pFVar3);
        }
        lVar6 = lVar6 + 1;
        face_edges = face_edges + 1;
      } while (lVar6 != 6);
      this->pending_additions_begin_ = batch->additions_end;
      if (local_110.saved_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.saved_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_110.shape_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.shape_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar6 = 0x78;
      do {
        pvVar4 = *(void **)((long)&local_1a8[0].
                                   super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4);
        }
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != -0x18);
      batch = batch + 1;
    } while (batch != pBVar5);
  }
  if (local_1c8.
      super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_start != (BatchDescriptor *)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::ApplyUpdatesInternal() {
  // Check whether we have so many edges to process that we should process
  // them in multiple batches to save memory.  Building the index can use up
  // to 20x as much memory (per edge) as the final index size.
  vector<BatchDescriptor> batches;
  GetUpdateBatches(&batches);
  int i = 0;
  for (const BatchDescriptor& batch : batches) {
    vector<FaceEdge> all_edges[6];
    S2_VLOG(1) << "Batch " << i++ << ": shape_limit=" << batch.additions_end
               << ", edges=" << batch.num_edges;

    ReserveSpace(batch, all_edges);
    InteriorTracker tracker;
    if (pending_removals_) {
      // The first batch implicitly includes all shapes being removed.
      for (const auto& pending_removal : *pending_removals_) {
        RemoveShape(pending_removal, all_edges, &tracker);
      }
      pending_removals_.reset(nullptr);
    }
    for (int id = pending_additions_begin_; id < batch.additions_end; ++id) {
      AddShape(id, all_edges, &tracker);
    }
    for (int face = 0; face < 6; ++face) {
      UpdateFaceEdges(face, all_edges[face], &tracker);
      // Save memory by clearing vectors after we are done with them.
      vector<FaceEdge>().swap(all_edges[face]);
    }
    pending_additions_begin_ = batch.additions_end;
  }
  // It is the caller's responsibility to update index_status_.
}